

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  ulong uVar1;
  int iVar2;
  SortOrder SVar3;
  QTreeView *pQVar4;
  QHeaderView *pQVar5;
  QTreeWidgetItem *pQVar6;
  uint in_ECX;
  int *in_R8;
  
  if (((__s[0x54] == '\0') && (*(int *)(__s + 0x50) != 0)) &&
     (*(long *)(*(long *)(__s + 8) + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    iVar2 = QHeaderView::sortIndicatorSection(pQVar5);
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    SVar3 = QHeaderView::sortIndicatorOrder(pQVar5);
    (**(code **)(*(long *)__s + 0x140))(__s,iVar2,SVar3);
  }
  iVar2 = (**(code **)(*(long *)__s + 0x80))(__s);
  if ((-1 < (int)(in_ECX | __c)) && ((int)in_ECX < iVar2)) {
    if ((*in_R8 < 0) || ((in_R8[1] < 0 || (*(long *)(in_R8 + 4) == 0)))) {
      pQVar6 = *(QTreeWidgetItem **)(__s + 0x10);
    }
    else {
      pQVar6 = *(QTreeWidgetItem **)(in_R8 + 4);
      if (pQVar6 != (QTreeWidgetItem *)0x0) {
        pQVar6 = *(QTreeWidgetItem **)(in_R8 + 2);
      }
    }
    if ((pQVar6 != (QTreeWidgetItem *)0x0) && (uVar1 = (pQVar6->children).d.size, __c < (int)uVar1))
    {
      if ((__c < 0) || (uVar1 <= (uint)__c)) {
        pQVar6 = (QTreeWidgetItem *)0x0;
      }
      else {
        QTreeWidgetItem::executePendingSort(pQVar6);
        pQVar6 = (pQVar6->children).d.ptr[(uint)__c];
      }
      if (pQVar6 != (QTreeWidgetItem *)0x0) {
        *(int *)this = __c;
        *(uint *)&this->field_0x4 = in_ECX;
        *(QTreeWidgetItem **)&this->field_0x8 = pQVar6;
        this->rootItem = (QTreeWidgetItem *)__s;
        return (char *)this;
      }
      *(undefined8 *)this = 0xffffffffffffffff;
      *(undefined8 *)&this->field_0x8 = 0;
      this->rootItem = (QTreeWidgetItem *)0x0;
      return (char *)this;
    }
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->rootItem = (QTreeWidgetItem *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QTreeModel::index(int row, int column, const QModelIndex &parent) const
{
    executePendingSort();

    int c = columnCount(parent);
    if (row < 0 || column < 0 || column >= c)
        return QModelIndex();

    QTreeWidgetItem *parentItem = parent.isValid() ? item(parent) : rootItem;
    if (parentItem && row < parentItem->childCount()) {
        QTreeWidgetItem *itm = parentItem->child(row);
        if (itm)
            return createIndex(row, column, itm);
        return QModelIndex();
    }

    return QModelIndex();
}